

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predicates.cxx
# Opt level: O0

int expansion_sum_zeroelim2(int elen,double *e,int flen,double *f,double *h)

{
  double dVar1;
  double dVar2;
  double around;
  double bround;
  double avirt;
  double bvirt;
  double enow;
  int hlast;
  int hindex;
  int findex;
  int eindex;
  double Qnew;
  double hh;
  double Q;
  double *h_local;
  double *f_local;
  int flen_local;
  double *e_local;
  int elen_local;
  
  enow._4_4_ = 0;
  hh = *f;
  for (hindex = 0; hindex < elen; hindex = hindex + 1) {
    dVar1 = hh + e[hindex];
    dVar2 = (hh - (dVar1 - (dVar1 - hh))) + (e[hindex] - (dVar1 - hh));
    if ((dVar2 != 0.0) || (NAN(dVar2))) {
      h[enow._4_4_] = dVar2;
      enow._4_4_ = enow._4_4_ + 1;
    }
    hh = dVar1;
  }
  h[enow._4_4_] = hh;
  enow._0_4_ = enow._4_4_;
  for (hlast = 1; hlast < flen; hlast = hlast + 1) {
    enow._4_4_ = 0;
    hh = f[hlast];
    for (hindex = 0; hindex <= enow._0_4_; hindex = hindex + 1) {
      dVar1 = hh + h[hindex];
      dVar2 = (hh - (dVar1 - (dVar1 - hh))) + (h[hindex] - (dVar1 - hh));
      if ((dVar2 != 0.0) || (NAN(dVar2))) {
        h[enow._4_4_] = dVar2;
        enow._4_4_ = enow._4_4_ + 1;
      }
      hh = dVar1;
    }
    h[enow._4_4_] = hh;
    enow._0_4_ = enow._4_4_;
  }
  return enow._0_4_ + 1;
}

Assistant:

int expansion_sum_zeroelim2(int elen, REAL *e, int flen, REAL *f, REAL *h)
/* e and h can be the same, but f and h cannot. */
{
  REAL Q, hh;
  INEXACT REAL Qnew;
  int eindex, findex, hindex, hlast;
  REAL enow;
  INEXACT REAL bvirt;
  REAL avirt, bround, around;

  hindex = 0;
  Q = f[0];
  for (eindex = 0; eindex < elen; eindex++) {
    enow = e[eindex];
    Two_Sum(Q, enow, Qnew, hh);
    Q = Qnew;
    if (hh != 0.0) {
      h[hindex++] = hh;
    }
  }
  h[hindex] = Q;
  hlast = hindex;
  for (findex = 1; findex < flen; findex++) {
    hindex = 0;
    Q = f[findex];
    for (eindex = 0; eindex <= hlast; eindex++) {
      enow = h[eindex];
      Two_Sum(Q, enow, Qnew, hh);
      Q = Qnew;
      if (hh != 0) {
        h[hindex++] = hh;
      }
    }
    h[hindex] = Q;
    hlast = hindex;
  }
  return hlast + 1;
}